

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coda-bin-cursor.c
# Opt level: O0

int coda_bin_cursor_get_num_elements(coda_cursor *cursor,long *num_elements)

{
  coda_type *local_28;
  long *num_elements_local;
  coda_cursor *cursor_local;
  
  if ((cursor->stack[cursor->n + -1].type)->backend < coda_backend_memory) {
    local_28 = (coda_type *)cursor->stack[cursor->n + -1].type;
  }
  else {
    local_28 = (cursor->stack[cursor->n + -1].type)->definition;
  }
  if (local_28->type_class < 2) {
    cursor_local._4_4_ = coda_ascbin_cursor_get_num_elements(cursor,num_elements);
  }
  else {
    *num_elements = 1;
    cursor_local._4_4_ = 0;
  }
  return cursor_local._4_4_;
}

Assistant:

int coda_bin_cursor_get_num_elements(const coda_cursor *cursor, long *num_elements)
{
    switch (coda_get_type_for_dynamic_type(cursor->stack[cursor->n - 1].type)->type_class)
    {
        case coda_array_class:
        case coda_record_class:
            return coda_ascbin_cursor_get_num_elements(cursor, num_elements);
        default:
            *num_elements = 1;  /* non-compound types type */
            break;
    }

    return 0;
}